

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O1

string * __thiscall filesystem::path::stem_abi_cxx11_(string *__return_storage_ptr__,path *this)

{
  string name;
  string local_30;
  
  filename_abi_cxx11_(&local_30,this);
  if (local_30._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::find_last_of((char *)&local_30,0xa0e1d6,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stem() const {
        std::string name = filename();
        if (name.empty())
            return "";
        return name.substr(0, name.find_last_of("."));
    }